

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O3

int __thiscall ncnn::PReLU::forward_inplace(PReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  void *pvVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  iVar3 = bottom_top_blob->dims;
  if (iVar3 == 3) {
    iVar3 = bottom_top_blob->c;
    if (0 < (long)iVar3) {
      uVar8 = bottom_top_blob->h * bottom_top_blob->w;
      pvVar9 = bottom_top_blob->data;
      sVar6 = bottom_top_blob->cstep;
      iVar4 = this->num_slope;
      sVar7 = bottom_top_blob->elemsize;
      lVar11 = 0;
      do {
        lVar12 = 0;
        if (1 < iVar4) {
          lVar12 = lVar11;
        }
        if (0 < (int)uVar8) {
          fVar1 = *(float *)((long)(this->slope_data).data + lVar12 * 4);
          uVar10 = 0;
          do {
            fVar2 = *(float *)((long)pvVar9 + uVar10 * 4);
            if (fVar2 < 0.0) {
              *(float *)((long)pvVar9 + uVar10 * 4) = fVar2 * fVar1;
            }
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
        }
        lVar11 = lVar11 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar6 * sVar7);
      } while (lVar11 != iVar3);
    }
  }
  else if (iVar3 == 2) {
    iVar3 = bottom_top_blob->h;
    if (0 < (long)iVar3) {
      uVar8 = bottom_top_blob->w;
      pvVar9 = bottom_top_blob->data;
      sVar6 = bottom_top_blob->elemsize;
      iVar4 = this->num_slope;
      uVar10 = 0;
      do {
        uVar13 = uVar10 & 0xffffffff;
        if (iVar4 < 2) {
          uVar13 = 0;
        }
        if (0 < (int)uVar8) {
          fVar1 = *(float *)((long)(this->slope_data).data + uVar13 * 4);
          uVar13 = 0;
          do {
            fVar2 = *(float *)((long)pvVar9 + uVar13 * 4);
            if (fVar2 < 0.0) {
              *(float *)((long)pvVar9 + uVar13 * 4) = fVar2 * fVar1;
            }
            uVar13 = uVar13 + 1;
          } while (uVar8 != uVar13);
        }
        uVar10 = uVar10 + 1;
        pvVar9 = (void *)((long)pvVar9 + (long)(int)uVar8 * sVar6);
      } while (uVar10 != (long)iVar3);
    }
  }
  else if (iVar3 == 1) {
    uVar8 = bottom_top_blob->w;
    pvVar9 = bottom_top_blob->data;
    if (this->num_slope < 2) {
      if (0 < (int)uVar8) {
        fVar1 = *(this->slope_data).data;
        uVar10 = 0;
        do {
          fVar2 = *(float *)((long)pvVar9 + uVar10 * 4);
          if (fVar2 < 0.0) {
            *(float *)((long)pvVar9 + uVar10 * 4) = fVar2 * fVar1;
          }
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
    }
    else if (0 < (int)uVar8) {
      pvVar5 = (this->slope_data).data;
      uVar10 = 0;
      do {
        fVar1 = *(float *)((long)pvVar9 + uVar10 * 4);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar9 + uVar10 * 4) = fVar1 * *(float *)((long)pvVar5 + uVar10 * 4);
        }
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
  }
  return 0;
}

Assistant:

int PReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        if (num_slope > 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float slope = slope_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];

            for (int j=0; j<w; j++)
            {
                if (ptr[j] < 0)
                    ptr[j] *= slope;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];

            for (int i=0; i<size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}